

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

void __thiscall kiste::line_t::line_t(line_t *this,parse_context *ctx,line_data_t *line_data)

{
  line_data_t::line_data_t(&this->super_line_data_t,line_data);
  this->_previous_line_ends_with_text = false;
  this->_next_line_starts_with_text = false;
  this->_curly_level = ctx->_curly_level;
  if ((this->super_line_data_t)._type == text) {
    line_data_t::enforce_at_least_one_segment(&this->super_line_data_t);
    if ((this->super_line_data_t)._segments.
        super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
        super__Vector_impl_data._M_finish[-1]._type == trim_trailing_return) {
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::pop_back
                (&(this->super_line_data_t)._segments);
      line_data_t::enforce_at_least_one_segment(&this->super_line_data_t);
    }
    if (ctx->_has_trailing_return == true) {
      line_data_t::enforce_trailing_text_segment(&this->super_line_data_t);
      std::__cxx11::string::push_back
                ((char)(this->super_line_data_t)._segments.
                       super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x20);
    }
  }
  return;
}

Assistant:

line_t::line_t(const parse_context& ctx, const line_data_t& line_data) : line_data_t(line_data)
  {
    _curly_level = ctx._curly_level;
    if (_type == line_type::text)
    {
      enforce_at_least_one_segment();
      if (_segments.back()._type == segment_type::trim_trailing_return)
      {
        _segments.pop_back();
        enforce_at_least_one_segment();
      }
      if (ctx._has_trailing_return)
      {
        enforce_trailing_text_segment();
        _segments.back()._text.push_back('\n');
      }
    }
  }